

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_finit.c
# Opt level: O3

int unknownEvent(void *arg,mpt_event *ev)

{
  mpt_message *pmVar1;
  size_t sVar2;
  int type_00;
  int iVar3;
  char *where;
  char *pcVar4;
  uint8_t type;
  mpt_message msg;
  byte local_39;
  mpt_message local_38;
  
  if (ev == (mpt_event *)0x0) {
    return 0;
  }
  if (ev->id == 0) {
    pmVar1 = ev->msg;
    if (pmVar1 == (mpt_message *)0x0) {
      if (ev->reply != (mpt_reply_context *)0x0) {
        mpt_context_reply(ev->reply,-0x10,"%s","message required");
        goto LAB_00113703;
      }
      where = "mpt::event::unknown";
      pcVar4 = "message required";
      iVar3 = 3;
      type_00 = 3;
    }
    else {
      local_38.used = pmVar1->used;
      local_38.base = pmVar1->base;
      local_38.cont = pmVar1->cont;
      local_38.clen = pmVar1->clen;
      sVar2 = mpt_message_read(&local_38,1,&local_39);
      if (sVar2 != 0) {
        if (ev->reply == (mpt_reply_context *)0x0) {
          mpt_log((mpt_logger *)arg,"mpt::event::unknown",3,"%s: %02x",
                  "unable to process message type");
        }
        else {
          mpt_context_reply(ev->reply,-4,"%s: %02x","unable to process message type",(ulong)local_39
                           );
        }
        return 2;
      }
      where = "unknownEvent";
      pcVar4 = "empty message";
      iVar3 = 0;
      type_00 = 4;
    }
    mpt_log((mpt_logger *)arg,where,type_00,"%s",pcVar4);
  }
  else {
    if (ev->reply == (mpt_reply_context *)0x0) {
      mpt_log((mpt_logger *)arg,"mpt::event::unknown",3,"%s: %lx","invalid command");
    }
    else {
      mpt_context_reply(ev->reply,-1,"%s: %lx","invalid command",ev->id);
    }
    ev->id = 0;
LAB_00113703:
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

static int unknownEvent(void *arg, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt::event::unknown";
	MPT_INTERFACE(logger) *log = arg;
	
	if (!ev) {
		return 0;
	}
	/* bad event id */
	if (ev->id) {
		if (ev->reply) {
			mpt_context_reply(ev->reply, MPT_ERROR(BadArgument), "%s: %" PRIxPTR,
			                  MPT_tr("invalid command"), ev->id);
		} else {
			mpt_log(log, _func, MPT_LOG(Error), "%s: %" PRIxPTR,
			        MPT_tr("invalid command"), ev->id);
		}
		ev->id = 0;
		return MPT_EVENTFLAG(Default) | MPT_EVENTFLAG(Fail);
	}
	/* bad default event */
	if (!ev->msg) {
		if (ev->reply) {
			mpt_context_reply(ev->reply, MPT_ERROR(MissingData), "%s",
			                  MPT_tr("message required"));
		} else {
			mpt_log(log, _func, MPT_LOG(Error), "%s",
			        MPT_tr("message required"));
		}
		return MPT_EVENTFLAG(Default) | MPT_EVENTFLAG(Fail);
	}
	/* bad message type */
	else {
		MPT_STRUCT(message) msg = *ev->msg;
		uint8_t type;
		
		if (!mpt_message_read(&msg, 1, &type)) {
			mpt_log(log, __func__, MPT_LOG(Warning), "%s", MPT_tr("empty message"));
			return MPT_EVENTFLAG(None);
		}
		if (ev->reply) {
			mpt_context_reply(ev->reply, MPT_ERROR(BadOperation), "%s: %02x",
			                  MPT_tr("unable to process message type"), type);
		} else {
			mpt_log(log, _func, MPT_LOG(Error), "%s: %02x",
			        MPT_tr("unable to process message type"), type);
		}
		return MPT_EVENTFLAG(Fail);
	}
}